

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<bool,_8UL> * __thiscall
spirv_cross::SmallVector<bool,_8UL>::operator=
          (SmallVector<bool,_8UL> *this,SmallVector<bool,_8UL> *other)

{
  bool *pbVar1;
  size_t sVar2;
  bool *pbVar3;
  size_t sVar4;
  
  if (this != other) {
    (this->super_VectorView<bool>).buffer_size = 0;
    reserve(this,(other->super_VectorView<bool>).buffer_size);
    pbVar1 = (other->super_VectorView<bool>).ptr;
    sVar2 = (other->super_VectorView<bool>).buffer_size;
    pbVar3 = (this->super_VectorView<bool>).ptr;
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      pbVar3[sVar4] = pbVar1[sVar4];
    }
    (this->super_VectorView<bool>).buffer_size = sVar2;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}